

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O1

void __thiscall eglu::NativeWindow::setVisibility(NativeWindow *this,Visibility visibility)

{
  Capability CVar1;
  NotSupportedError *this_00;
  pointer_____offset_0x10___ *ppuVar2;
  
  CVar1 = this->m_capabilities;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((CVar1 & CAPABILITY_CHANGE_VISIBILITY) == 0) {
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeWindow doesn\'t support changing visibility",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x4f);
    ppuVar2 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::InternalError::InternalError
              ((InternalError *)this_00,(char *)0x0,
               "(m_capabilities & CAPABILITY_CHANGE_VISIBILITY) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x4e);
    ppuVar2 = &tcu::InternalError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar2,tcu::Exception::~Exception);
}

Assistant:

void NativeWindow::setVisibility (WindowParams::Visibility visibility)
{
	DE_UNREF(visibility);
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_CHANGE_VISIBILITY) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support changing visibility", DE_NULL, __FILE__, __LINE__);
}